

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int checkColumnOverlap(IdList *pIdList,ExprList *pEList)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = 1;
  if (pEList != (ExprList *)0x0 && pIdList != (IdList *)0x0) {
    iVar2 = pEList->nExpr;
    if (0 < (long)iVar2) {
      lVar3 = 0;
      do {
        iVar1 = sqlite3IdListIndex(pIdList,*(char **)((long)&pEList->a[0].zEName + lVar3));
        if (-1 < iVar1) {
          return 1;
        }
        lVar3 = lVar3 + 0x18;
      } while ((long)iVar2 * 0x18 != lVar3);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int checkColumnOverlap(IdList *pIdList, ExprList *pEList){
  int e;
  if( pIdList==0 || NEVER(pEList==0) ) return 1;
  for(e=0; e<pEList->nExpr; e++){
    if( sqlite3IdListIndex(pIdList, pEList->a[e].zEName)>=0 ) return 1;
  }
  return 0;
}